

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  uint64_t local_198;
  uintptr_t local_188;
  upb_value local_180;
  upb_value val_1;
  uintptr_t key_1;
  intptr_t iter_1;
  uint64_t uStack_160;
  int hashsize_lg2;
  size_t hash_size;
  ulong uStack_150;
  uint32_t hash_count;
  uintptr_t arr_size;
  upb_inttable new_t;
  uint local_118;
  int size_lg2;
  uint32_t arr_count;
  int bucket;
  upb_value val;
  uintptr_t key;
  intptr_t iter;
  uintptr_t max [17];
  int local_68 [2];
  uint32_t counts [17];
  upb_Arena *a_local;
  upb_inttable *t_local;
  
  unique0x10000357 = a;
  memset(local_68,0,0x44);
  memset(&iter,0,0x88);
  key = 0xffffffffffffffff;
  while (_Var1 = upb_inttable_next(t,&val.val,(upb_value *)&arr_count,(intptr_t *)&key), _Var1) {
    iVar2 = log2ceil(val.val);
    if (val.val < max[(long)iVar2 + -1]) {
      local_188 = max[(long)iVar2 + -1];
    }
    else {
      local_188 = val.val;
    }
    max[(long)iVar2 + -1] = local_188;
    local_68[iVar2] = local_68[iVar2] + 1;
  }
  sVar3 = upb_inttable_count(t);
  local_118 = (uint)sVar3;
  for (new_t.array_count = 0x10; 0 < (int)new_t.array_count;
      new_t.array_count = new_t.array_count - 1) {
    if (local_68[(int)new_t.array_count] != 0) {
      if ((double)(1 << ((byte)new_t.array_count & 0x1f)) * 0.1 <= (double)local_118) break;
      local_118 = local_118 - local_68[(int)new_t.array_count];
    }
  }
  sVar3 = upb_inttable_count(t);
  if (sVar3 < local_118) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0x335,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  uStack_150 = max[(long)(int)new_t.array_count + -1] + 1;
  sVar3 = upb_inttable_count(t);
  hash_size._4_4_ = (int)sVar3 - local_118;
  if (hash_size._4_4_ == 0) {
    local_198 = 0;
  }
  else {
    local_198 = _upb_entries_needed_for((ulong)hash_size._4_4_);
  }
  uStack_160 = local_198;
  iter_1._4_4_ = log2ceil(local_198);
  _Var1 = upb_inttable_sizedinit
                    ((upb_inttable *)&arr_size,(uint32_t)uStack_150,iter_1._4_4_,
                     stack0xffffffffffffffe0);
  if (_Var1) {
    key_1 = 0xffffffffffffffff;
    while (_Var1 = upb_inttable_next(t,&val_1.val,&local_180,(intptr_t *)&key_1), _Var1) {
      upb_inttable_insert((upb_inttable *)&arr_size,val_1.val,local_180,stack0xffffffffffffffe0);
    }
    if ((uint)new_t.presence_mask != uStack_150) {
      __assert_fail("new_t.array_size == arr_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x34c,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
    }
    memcpy(t,&arr_size,0x28);
    t_local._7_1_ = true;
  }
  else {
    t_local._7_1_ = false;
  }
  return t_local._7_1_;
}

Assistant:

bool upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  uint32_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  uint32_t arr_count = upb_inttable_count(t);

  // Scan all buckets except capped bucket
  int size_lg2 = ARRAY_SIZE(counts) - 1;
  for (; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  upb_inttable new_t;
  {
    /* Insert all elements into new, perfectly-sized table. */
    uintptr_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    uint32_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? _upb_entries_needed_for(hash_count) : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    if (!upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a)) {
      return false;
    }

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
  }
  *t = new_t;
  return true;
}